

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeUnknownMessageSetItemsToArray
                    (UnknownFieldSet *unknown_fields,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  Type TVar2;
  uint32_t value;
  UnknownField *this;
  uint8_t *puVar3;
  UnknownField *field;
  int i;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  UnknownFieldSet *unknown_fields_local;
  
  field._4_4_ = 0;
  stream_local = (EpsCopyOutputStream *)target;
  while( true ) {
    iVar1 = UnknownFieldSet::field_count(unknown_fields);
    if (iVar1 <= field._4_4_) break;
    this = UnknownFieldSet::field(unknown_fields,field._4_4_);
    TVar2 = UnknownField::type(this);
    if (TVar2 == TYPE_LENGTH_DELIMITED) {
      puVar3 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
      puVar3 = io::CodedOutputStream::WriteVarint32ToArray(0xb,puVar3);
      puVar3 = io::CodedOutputStream::WriteVarint32ToArray(0x10,puVar3);
      value = UnknownField::number(this);
      puVar3 = io::CodedOutputStream::WriteVarint32ToArray(value,puVar3);
      puVar3 = io::CodedOutputStream::WriteVarint32ToArray(0x1a,puVar3);
      puVar3 = UnknownField::InternalSerializeLengthDelimitedNoTag(this,puVar3,stream);
      puVar3 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar3);
      stream_local = (EpsCopyOutputStream *)io::CodedOutputStream::WriteVarint32ToArray(0xc,puVar3);
    }
    field._4_4_ = field._4_4_ + 1;
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* WireFormat::InternalSerializeUnknownMessageSetItemsToArray(
    const UnknownFieldSet& unknown_fields, uint8_t* target,
    io::EpsCopyOutputStream* stream) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      target = stream->EnsureSpace(target);
      // Start group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemStartTag, target);

      // Write type ID.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetTypeIdTag, target);
      target =
          io::CodedOutputStream::WriteVarint32ToArray(field.number(), target);

      // Write message.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetMessageTag, target);

      target = field.InternalSerializeLengthDelimitedNoTag(target, stream);

      target = stream->EnsureSpace(target);
      // End group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemEndTag, target);
    }
  }

  return target;
}